

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdKelvinDepthClamp::is_valid_val(MthdKelvinDepthClamp *this)

{
  _Bool _Var1;
  MthdKelvinDepthClamp *this_local;
  
  _Var1 = nv04_pgraph_is_kelvin_class
                    (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffffeee) == 0;
  }
  else {
    _Var1 = nv04_pgraph_is_rankine_class
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    if (_Var1) {
      this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xffffeeee) == 0;
    }
    else {
      this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffffeee) == 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (nv04_pgraph_is_kelvin_class(&exp)) {
			return !(val & ~0x111);
		} else if (nv04_pgraph_is_rankine_class(&exp)) {
			return !(val & ~0x1111);
		} else {
			return !(val & ~0x111);
		}
	}